

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O3

void __thiscall
Engine_testSetDoubleWithTags_Test::~Engine_testSetDoubleWithTags_Test
          (Engine_testSetDoubleWithTags_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Engine, testSetDoubleWithTags) {
    Engine e("test", std::move(std::make_unique<TestHandler>()));
    e.Set("gauge.value", 100.0005, Tag("Foo", "Bar"), Tag("Hello", "World"));
    const auto &h = e.GetHandlers()[0];
    auto *th = dynamic_cast<TestHandler *>(h.get());
    ASSERT_EQ(1, th->doubleMeasures.size());
    auto im = th->doubleMeasures[0];
    ASSERT_EQ("test.gauge.value", im.name);
    ASSERT_EQ(MetricType::Gauge, im.type);
    ASSERT_EQ(1, im.rate);
    ASSERT_EQ(100.0005, im.value);
    ASSERT_EQ(2, im.tags.size());
    ASSERT_EQ("Foo", im.tags[0].name);
    ASSERT_EQ("Bar", im.tags[0].value);
    ASSERT_EQ("Hello", im.tags[1].name);
    ASSERT_EQ("World", im.tags[1].value);
}